

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementBeamEuler::ComputeStiffnessMatrix(ChElementBeamEuler *this)

{
  ChMatrixDynamic<> *expr;
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  element_type *peVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  bool bVar22;
  double *pdVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  double *pdVar27;
  double *pdVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  double dVar52;
  undefined1 auVar53 [16];
  double dVar54;
  undefined1 auVar55 [16];
  double dVar56;
  double dVar57;
  undefined1 auVar58 [16];
  double dVar59;
  ChMatrixDynamic<> CKtemp;
  ChMatrix33<double> Rotsect;
  assign_op<double,_double> local_181;
  double local_180;
  DenseStorage<double,__1,__1,__1,_1> local_178;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  double local_130;
  double local_128;
  double local_120;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_118;
  ChMatrix33<double> local_d0;
  undefined1 local_88 [16];
  ChMatrixRef local_78;
  ChMatrixRef local_48;
  undefined1 extraout_var [56];
  
  local_158._8_8_ = local_158._0_8_;
  local_148._8_8_ = local_148._0_8_;
  auVar30 = in_ZMM0._0_16_;
  peVar15 = (this->section).
            super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar15 == (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0xae,"void chrono::fea::ChElementBeamEuler::ComputeStiffnessMatrix()");
  }
  (*(peVar15->super_ChBeamSection)._vptr_ChBeamSection[2])();
  local_148._0_8_ = auVar30._0_8_;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[4])();
  local_180 = auVar30._0_8_;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[5])();
  local_158._0_8_ = auVar30._0_8_;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[3])();
  local_120 = auVar30._0_8_;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[7])();
  local_88 = auVar30;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[8])();
  local_130 = auVar30._0_8_;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[9])();
  local_128 = auVar30._0_8_;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[10])();
  lVar16 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
  if ((0 < lVar16) &&
     (lVar17 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
               .m_cols, 0 < lVar17)) {
    dVar2 = (this->super_ChElementBeam).length;
    dVar59 = (double)local_148._0_8_ / dVar2;
    expr = &this->Km;
    pdVar23 = (expr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
              m_data;
    *pdVar23 = dVar59;
    if ((lVar16 != 1) && (lVar17 != 1)) {
      dVar51 = dVar2 * dVar2;
      dVar45 = ((double)local_158._0_8_ * 12.0) / (dVar2 * dVar51);
      pdVar23[lVar17 + 1] = dVar45;
      if ((2 < lVar16) && (2 < lVar17)) {
        dVar52 = (local_180 * 12.0) / (dVar2 * dVar51);
        pdVar23[lVar17 * 2 + 2] = dVar52;
        if ((3 < lVar16) && (3 < lVar17)) {
          dVar54 = local_120 / dVar2;
          pdVar23[lVar17 * 3 + 3] = dVar54;
          if ((4 < lVar16) && (4 < lVar17)) {
            dVar57 = (local_180 * 4.0) / dVar2;
            pdVar23[lVar17 * 4 + 4] = dVar57;
            if ((5 < lVar16) && (5 < lVar17)) {
              dVar56 = ((double)local_158._0_8_ * 4.0) / dVar2;
              pdVar23[lVar17 * 5 + 5] = dVar56;
              if (((((((6 < lVar16) && (6 < lVar17)) &&
                     (pdVar23[lVar17 * 6 + 6] = dVar59, 7 < lVar16)) &&
                    ((7 < lVar17 && (pdVar23[lVar17 * 7 + 7] = dVar45, 8 < lVar16)))) &&
                   (8 < lVar17)) &&
                  (((pdVar23[lVar17 * 8 + 8] = dVar52, 9 < lVar16 && (9 < lVar17)) &&
                   (pdVar23[lVar17 * 9 + 9] = dVar54, 10 < lVar16)))) &&
                 (((10 < lVar17 && (pdVar23[lVar17 * 10 + 10] = dVar57, 0xb < lVar16)) &&
                  (0xb < lVar17)))) {
                dVar57 = (local_180 * 6.0) / dVar51;
                dVar51 = ((double)local_158._0_8_ * 6.0) / dVar51;
                pdVar23[lVar17 * 0xb + 0xb] = dVar56;
                auVar58._0_8_ = -dVar59;
                auVar58._8_8_ = 0x8000000000000000;
                dVar59 = (double)vmovlpd_avx(auVar58);
                pdVar23[6] = dVar59;
                auVar46._0_8_ = -dVar45;
                auVar46._8_8_ = 0x8000000000000000;
                pdVar28 = pdVar23 + lVar17;
                dVar59 = (double)vmovlpd_avx(auVar46);
                pdVar28[7] = dVar59;
                auVar47._0_8_ = -dVar52;
                auVar47._8_8_ = 0x8000000000000000;
                dVar59 = (double)vmovlpd_avx(auVar47);
                pdVar23[lVar17 * 2 + 8] = dVar59;
                auVar48._0_8_ = -dVar54;
                auVar48._8_8_ = 0x8000000000000000;
                dVar59 = (double)vmovlpd_avx(auVar48);
                pdVar23[lVar17 * 3 + 9] = dVar59;
                pdVar23[lVar17 * 4 + 10] = (local_180 + local_180) / dVar2;
                pdVar23[lVar17 * 5 + 0xb] =
                     ((double)local_158._0_8_ + (double)local_158._0_8_) / dVar2;
                pdVar23[lVar17 * 4 + 8] = dVar57;
                auVar49._0_8_ = -dVar51;
                auVar49._8_8_ = 0x8000000000000000;
                dVar2 = (double)vmovlpd_avx(auVar49);
                pdVar23[lVar17 * 5 + 7] = dVar2;
                pdVar28[0xb] = dVar51;
                auVar33._0_8_ = -dVar57;
                auVar33._8_8_ = 0x8000000000000000;
                dVar2 = (double)vmovlpd_avx(auVar33);
                pdVar23[lVar17 * 2 + 10] = dVar2;
                pdVar28[5] = dVar51;
                dVar2 = (double)vmovlpd_avx(auVar33);
                pdVar23[lVar17 * 2 + 4] = dVar2;
                dVar2 = (double)vmovlpd_avx(auVar49);
                pdVar23[lVar17 * 7 + 0xb] = dVar2;
                pdVar23[lVar17 * 8 + 10] = dVar57;
                pdVar23 = pdVar23 + 1;
                lVar25 = 1;
                lVar26 = 0;
                do {
                  if (lVar26 != 0xb) {
                    if (lVar16 <= lVar26) goto LAB_00670d58;
                    lVar29 = 0;
                    pdVar27 = pdVar28;
                    do {
                      if ((lVar17 <= lVar25 + lVar29) || (lVar16 <= lVar25 + lVar29))
                      goto LAB_00670d58;
                      *pdVar27 = pdVar23[lVar29];
                      pdVar27 = pdVar27 + lVar17;
                      lVar1 = lVar26 + 1 + lVar29;
                      lVar29 = lVar29 + 1;
                    } while (lVar1 != 0xb);
                  }
                  lVar26 = lVar26 + 1;
                  lVar25 = lVar25 + 1;
                  pdVar23 = pdVar23 + lVar17 + 1;
                  pdVar28 = pdVar28 + lVar17 + 1;
                } while (lVar26 != 0xc);
                local_148 = auVar30;
                (*(((this->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChBeamSection)._vptr_ChBeamSection[6])();
                if ((auVar30._0_8_ != 0.0) || (NAN(auVar30._0_8_))) {
                  (*(((this->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_ChBeamSection)._vptr_ChBeamSection[6])();
                  auVar19._8_8_ = 0x8000000000000000;
                  auVar19._0_8_ = 0x8000000000000000;
                  local_158 = vxorpd_avx512vl(auVar30,auVar19);
                  local_180 = cos(local_158._0_8_);
                  auVar32._0_8_ = sin((double)local_158._0_8_);
                  auVar32._8_56_ = extraout_var;
                  local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0] = 1.0;
                  local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] = 0.0;
                  local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[2] = -0.0;
                  local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] = auVar32._0_8_ * 0.0;
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = local_180;
                  dVar2 = local_180 * 0.0;
                  local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3] = local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[6] - dVar2;
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ =
                       local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[6];
                  auVar30 = vfmadd213sd_fma(ZEXT816(0),auVar30,auVar55);
                  local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4] = auVar30._0_8_;
                  local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] = dVar2 + local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array[6];
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = dVar2;
                  auVar30 = vfmsub213sd_fma(auVar50,ZEXT816(0) << 0x40,auVar32._0_16_);
                  local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7] = auVar30._0_8_;
                  local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8] = local_180;
                  local_178.m_cols = 0;
                  local_178.m_data = (double *)0x0;
                  local_178.m_rows = 0;
                  local_d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5] = auVar32._0_8_;
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_178,0x90,0xc,0xc);
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data = (PointerType)local_178.m_rows;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value = local_178.m_cols;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value = 0;
                  if ((local_178.m_cols | local_178.m_rows) < 0) {
                    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                                 );
                  }
                  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                            ((Matrix<double,__1,__1,_1,__1,__1> *)&local_178,
                             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                              *)&local_118,&local_181);
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data = (PointerType)0x0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value = 0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value = 0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .m_stride.m_outer.m_value = 0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
                       = (double *)0x0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
                       = 0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
                       = 0;
                  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
                  construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>
                              *)&local_118,expr);
                  local_78.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .m_stride.m_outer.m_value = 0;
                  local_78.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data = local_178.m_data;
                  local_78.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value = local_178.m_rows;
                  local_78.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value = local_178.m_cols;
                  if ((local_178.m_rows | local_178.m_cols) < 0 && local_178.m_data != (double *)0x0
                     ) {
                    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                                  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                                 );
                  }
                  local_78.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .m_stride.m_outer.m_value = local_178.m_cols;
                  ChMatrixCorotation::ComputeCK(&local_118,&local_d0,4,&local_78);
                  if (local_118.m_object.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_data != (double *)0x0) {
                    free((void *)local_118.m_object.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                 m_storage.m_data[-1]);
                  }
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data = (PointerType)0x0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value = 0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value = 0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .m_stride.m_outer.m_value = 0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
                       = (double *)0x0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
                       = 0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
                       = 0;
                  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
                  construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>
                              *)&local_118,&local_178);
                  local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data = (PointerType)0x0;
                  local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value = 0;
                  local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value = 0;
                  local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .m_stride.m_outer.m_value = 0;
                  bVar22 = Eigen::
                           RefBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>
                           ::construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                                     ((RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                                       *)&local_48,expr);
                  if (!bVar22) {
                    __assert_fail("success","/usr/include/eigen3/Eigen/src/Core/Ref.h",0x130,
                                  "Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>::Ref(PlainObjectBase<Derived> &, typename internal::enable_if<bool(Traits::template match<Derived>::MatchAtCompileTime), Derived>::type *) [PlainObjectType = Eigen::Matrix<double, -1, -1, 1>, Options = 0, StrideType = Eigen::OuterStride<>, Derived = Eigen::Matrix<double, -1, -1, 1>]"
                                 );
                  }
                  ChMatrixCorotation::ComputeKCt(&local_118,&local_d0,4,&local_48);
                  if (local_118.m_object.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_data != (double *)0x0) {
                    free((void *)local_118.m_object.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                 m_storage.m_data[-1]);
                  }
                  if (local_178.m_data != (double *)0x0) {
                    free((void *)local_178.m_data[-1]);
                  }
                }
                auVar53._8_8_ = 0;
                auVar53._0_8_ = local_130;
                if ((((local_88._0_8_ != 0.0) || (NAN(local_88._0_8_))) || (local_130 != 0.0)) ||
                   (NAN(local_130))) {
                  lVar16 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
                  if (lVar16 < 1) goto LAB_00670d58;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data;
                  uVar18 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  uVar24 = 0;
                  do {
                    if (((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 < 5))
                    goto LAB_00670d58;
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = pdVar23[uVar24];
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = pdVar23[uVar18 * 4 + uVar24];
                    auVar30 = vfmadd213sd_fma(auVar31,auVar53,auVar3);
                    pdVar23[uVar18 * 4 + uVar24] = auVar30._0_8_;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != 0xc);
                  lVar16 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
                  if (lVar16 < 1) goto LAB_00670d58;
                  auVar20._8_8_ = 0x8000000000000000;
                  auVar20._0_8_ = 0x8000000000000000;
                  auVar30 = vxorpd_avx512vl(local_88,auVar20);
                  uVar18 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data;
                  uVar24 = 0;
                  do {
                    if (((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 < 6))
                    goto LAB_00670d58;
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = pdVar23[uVar24];
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = pdVar23[uVar18 * 5 + uVar24];
                    auVar33 = vfmadd213sd_fma(auVar34,auVar30,auVar4);
                    pdVar23[uVar18 * 5 + uVar24] = auVar33._0_8_;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != 0xc);
                  lVar16 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
                  if (lVar16 < 7) goto LAB_00670d58;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data;
                  uVar18 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  uVar24 = 0;
                  do {
                    if (((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 < 0xb))
                    goto LAB_00670d58;
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = pdVar23[uVar18 * 6 + uVar24];
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = pdVar23[uVar18 * 10 + uVar24];
                    auVar33 = vfmadd213sd_fma(auVar35,auVar53,auVar5);
                    pdVar23[uVar18 * 10 + uVar24] = auVar33._0_8_;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != 0xc);
                  lVar16 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
                  if (lVar16 < 7) goto LAB_00670d58;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data;
                  uVar18 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  uVar24 = 0;
                  do {
                    if (((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 < 0xc))
                    goto LAB_00670d58;
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = pdVar23[uVar18 * 6 + uVar24];
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = pdVar23[uVar18 * 0xb + uVar24];
                    auVar33 = vfmadd213sd_fma(auVar36,auVar30,auVar6);
                    pdVar23[uVar18 * 0xb + uVar24] = auVar33._0_8_;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != 0xc);
                  lVar16 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
                  lVar17 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data + 4;
                  lVar25 = 0;
                  do {
                    if (((lVar16 <= lVar25) || (lVar17 < 1)) || (lVar17 < 5)) goto LAB_00670d58;
                    auVar37._8_8_ = 0;
                    auVar37._0_8_ = pdVar23[-4];
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = *pdVar23;
                    auVar33 = vfmadd213sd_fma(auVar37,auVar53,auVar7);
                    *pdVar23 = auVar33._0_8_;
                    lVar25 = lVar25 + 1;
                    pdVar23 = pdVar23 + lVar17;
                  } while (lVar25 != 0xc);
                  lVar16 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
                  lVar17 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data + 5;
                  lVar25 = 0;
                  do {
                    if (((lVar16 <= lVar25) || (lVar17 < 1)) || (lVar17 < 6)) goto LAB_00670d58;
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = pdVar23[-5];
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = *pdVar23;
                    auVar33 = vfmadd213sd_fma(auVar38,auVar30,auVar8);
                    *pdVar23 = auVar33._0_8_;
                    lVar25 = lVar25 + 1;
                    pdVar23 = pdVar23 + lVar17;
                  } while (lVar25 != 0xc);
                  lVar16 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
                  lVar17 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data + 10;
                  lVar25 = 0;
                  do {
                    if (((lVar16 <= lVar25) || (lVar17 < 7)) || (lVar17 < 0xb)) goto LAB_00670d58;
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = pdVar23[-4];
                    auVar9._8_8_ = 0;
                    auVar9._0_8_ = *pdVar23;
                    auVar33 = vfmadd213sd_fma(auVar39,auVar53,auVar9);
                    *pdVar23 = auVar33._0_8_;
                    lVar25 = lVar25 + 1;
                    pdVar23 = pdVar23 + lVar17;
                  } while (lVar25 != 0xc);
                  lVar16 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
                  lVar17 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data + 0xb;
                  lVar25 = 0;
                  do {
                    if (((lVar16 <= lVar25) || (lVar17 < 7)) || (lVar17 < 0xc)) goto LAB_00670d58;
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = pdVar23[-5];
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = *pdVar23;
                    auVar33 = vfmadd213sd_fma(auVar40,auVar30,auVar10);
                    *pdVar23 = auVar33._0_8_;
                    lVar25 = lVar25 + 1;
                    pdVar23 = pdVar23 + lVar17;
                  } while (lVar25 != 0xc);
                }
                if (((local_128 == 0.0) && (!NAN(local_128))) &&
                   ((local_148._0_8_ == 0.0 && (!NAN(local_148._0_8_))))) {
                  return;
                }
                lVar16 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                         .m_storage.m_rows;
                if (1 < lVar16) {
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data;
                  uVar18 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  auVar21._8_8_ = 0x8000000000000000;
                  auVar21._0_8_ = 0x8000000000000000;
                  auVar30 = vxorpd_avx512vl(local_148,auVar21);
                  uVar24 = 0;
                  do {
                    if ((((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 == 2)) ||
                       (lVar16 < 4)) goto LAB_00670d58;
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = pdVar23[uVar18 + uVar24];
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = local_128 * pdVar23[uVar18 * 2 + uVar24];
                    auVar33 = vfmadd231sd_fma(auVar41,auVar30,auVar11);
                    pdVar23[uVar18 * 3 + uVar24] = auVar33._0_8_ + pdVar23[uVar18 * 3 + uVar24];
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != 0xc);
                  lVar16 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
                  if (7 < lVar16) {
                    pdVar23 = (this->Km).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data;
                    uVar18 = (this->Km).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    uVar24 = 0;
                    do {
                      if ((((~((long)uVar18 >> 0x3f) & uVar18) == uVar24) || (lVar16 == 8)) ||
                         (lVar16 < 10)) goto LAB_00670d58;
                      auVar12._8_8_ = 0;
                      auVar12._0_8_ = pdVar23[uVar18 * 7 + uVar24];
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ = local_128 * pdVar23[uVar18 * 8 + uVar24];
                      auVar33 = vfmadd231sd_fma(auVar42,auVar30,auVar12);
                      pdVar23[uVar18 * 9 + uVar24] = auVar33._0_8_ + pdVar23[uVar18 * 9 + uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != 0xc);
                    lVar16 = (this->Km).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_rows;
                    lVar17 = (this->Km).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    pdVar23 = (this->Km).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data + 3;
                    lVar25 = 0;
                    do {
                      if (((lVar16 <= lVar25) || (lVar17 < 2)) || ((lVar17 == 2 || (lVar17 < 4))))
                      goto LAB_00670d58;
                      auVar13._8_8_ = 0;
                      auVar13._0_8_ = pdVar23[-2];
                      auVar43._8_8_ = 0;
                      auVar43._0_8_ = local_128 * pdVar23[-1];
                      auVar33 = vfmadd231sd_fma(auVar43,auVar30,auVar13);
                      *pdVar23 = auVar33._0_8_ + *pdVar23;
                      lVar25 = lVar25 + 1;
                      pdVar23 = pdVar23 + lVar17;
                    } while (lVar25 != 0xc);
                    lVar16 = (this->Km).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_rows;
                    lVar17 = (this->Km).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    pdVar23 = (this->Km).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data + 9;
                    lVar25 = 0;
                    while (((lVar25 < lVar16 && (7 < lVar17)) && ((lVar17 != 8 && (9 < lVar17))))) {
                      auVar14._8_8_ = 0;
                      auVar14._0_8_ = pdVar23[-2];
                      auVar44._8_8_ = 0;
                      auVar44._0_8_ = local_128 * pdVar23[-1];
                      auVar33 = vfmadd231sd_fma(auVar44,auVar30,auVar14);
                      *pdVar23 = auVar33._0_8_ + *pdVar23;
                      lVar25 = lVar25 + 1;
                      pdVar23 = pdVar23 + lVar17;
                      if (lVar25 == 0xc) {
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00670d58:
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementBeamEuler::ComputeStiffnessMatrix() {
    assert(section);

    double EA = this->section->GetAxialRigidity();
    double EIyy = this->section->GetYbendingRigidity();
    double EIzz = this->section->GetZbendingRigidity();
    double GJ = this->section->GetXtorsionRigidity();
    double Cy = this->section->GetCentroidY();
    double Cz = this->section->GetCentroidZ();
    double Sy = this->section->GetShearCenterY();
    double Sz = this->section->GetShearCenterZ();

    double h = this->length;

    double om_xz = 0;  // For Euler-Bernoulli
    double om_xy = 0;  // For Euler-Bernoulli
    /*
    if (false) {
        //// TEST REDDY BEAMS
        double Ks_z = section->Ks_z;
        double Ks_y = section->Ks_y;
        double om_xz = E * Iyy / (G * Area * Ks_z * h);  // For Reddy's RBT
        double om_xy = E * Izz / (G * Area * Ks_y * h);  // For Reddy's RBT
    }
    */
    double u_xz = 1 + 12 * om_xz;
    double l_xz = 1 + 3 * om_xz;
    double e_xz = 1 - 6 * om_xz;
    double u_xy = 1 + 12 * om_xy;
    double l_xy = 1 + 3 * om_xy;
    double e_xy = 1 - 6 * om_xy;

    double k_u = EA / h;
    double k_f = GJ / h;

    double k_w = 12 * EIyy / (u_xz * h * h * h);
    double k_v = 12 * EIzz / (u_xy * h * h * h);

    double k_t = 4 * EIyy * l_xz / (u_xz * h);
    double k_p = 4 * EIzz * l_xy / (u_xy * h);

    double k_wt = 6 * EIyy / (u_xz * h * h);
    double k_vp = 6 * EIzz / (u_xy * h * h);

    double k_tt = 2 * EIyy * e_xz / (u_xz * h);
    double k_pp = 2 * EIzz * e_xy / (u_xy * h);

    Km(0, 0) = k_u;
    Km(1, 1) = k_v;
    Km(2, 2) = k_w;
    Km(3, 3) = k_f;
    Km(4, 4) = k_t;
    Km(5, 5) = k_p;
    Km(6, 6) = k_u;
    Km(7, 7) = k_v;
    Km(8, 8) = k_w;
    Km(9, 9) = k_f;
    Km(10, 10) = k_t;
    Km(11, 11) = k_p;

    Km(0, 6) = -k_u;
    Km(1, 7) = -k_v;
    Km(2, 8) = -k_w;
    Km(3, 9) = -k_f;
    Km(4, 10) = k_tt;
    Km(5, 11) = k_pp;

    Km(4, 8) = k_wt;
    Km(5, 7) = -k_vp;
    Km(1, 11) = k_vp;
    Km(2, 10) = -k_wt;

    Km(1, 5) = k_vp;
    Km(2, 4) = -k_wt;
    Km(7, 11) = -k_vp;
    Km(8, 10) = k_wt;

    // symmetric part;
    for (int r = 0; r < 12; r++)
        for (int c = r + 1; c < 12; c++)
            Km(c, r) = Km(r, c);

    // In case the section is rotated:
    if (this->section->GetSectionRotation()) {
        // Do [K]^ = [R][K][R]'
        ChMatrix33<> Rotsect;
        Rotsect.Set_A_Rxyz(ChVector<>(-section->GetSectionRotation(), 0, 0));
        ChMatrixDynamic<> CKtemp(12, 12);
        CKtemp.setZero();
        ChMatrixCorotation::ComputeCK(this->Km, Rotsect, 4, CKtemp);
        ChMatrixCorotation::ComputeKCt(CKtemp, Rotsect, 4, this->Km);
    }
    // In case the section has a centroid displacement:

    if (Cy || Cz) {
        // Do [K]" = [T_c][K]^[T_c]'

        for (int i = 0; i < 12; ++i)
            this->Km(4, i) += Cz * this->Km(0, i);
        for (int i = 0; i < 12; ++i)
            this->Km(5, i) += -Cy * this->Km(0, i);

        for (int i = 0; i < 12; ++i)
            this->Km(10, i) += Cz * this->Km(6, i);
        for (int i = 0; i < 12; ++i)
            this->Km(11, i) += -Cy * this->Km(6, i);

        for (int i = 0; i < 12; ++i)
            this->Km(i, 4) += Cz * this->Km(i, 0);
        for (int i = 0; i < 12; ++i)
            this->Km(i, 5) += -Cy * this->Km(i, 0);

        for (int i = 0; i < 12; ++i)
            this->Km(i, 10) += Cz * this->Km(i, 6);
        for (int i = 0; i < 12; ++i)
            this->Km(i, 11) += -Cy * this->Km(i, 6);
    }

    // In case the section has a shear center displacement:
    if (Sy || Sz) {
        // Do [K]?= [T_s][K]"[T_s]'

        for (int i = 0; i < 12; ++i)
            this->Km(3, i) +=
                - Sz * this->Km(1, i) + Sy * this->Km(2, i);
        for (int i = 0; i < 12; ++i)
            this->Km(9, i) +=
                - Sz * this->Km(7, i) + Sy * this->Km(8, i);

        for (int i = 0; i < 12; ++i)
            this->Km(i, 3) +=
                - Sz * this->Km(i, 1) + Sy * this->Km(i, 2);
        for (int i = 0; i < 12; ++i)
            this->Km(i, 9) +=
                - Sz * this->Km(i, 7) + Sy * this->Km(i, 8);
    }
}